

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_arith(jit_State *J,TRef rb,TRef rc,TValue *vb,TValue *vc,IROp op)

{
  int iVar1;
  TRef TVar2;
  double n;
  IROp op_local;
  TValue *vc_local;
  TValue *vb_local;
  TRef rc_local;
  TRef rb_local;
  jit_State *J_local;
  
  vb_local._4_4_ = conv_str_tonum(J,rb,vb);
  vb_local._0_4_ = conv_str_tonum(J,rc,vc);
  if ((((IR_BROR < op) && (op < IR_MUL)) && ((vb_local._4_4_ >> 0x18 & 0x1f) - 0xf < 5)) &&
     (((TRef)vb_local >> 0x18 & 0x1f) - 0xf < 5)) {
    n = lj_vm_foldarith(vb->n,vc->n,op - IR_ADD);
    iVar1 = numisint(n);
    if (iVar1 != 0) {
      (J->fold).ins.field_0.ot = ((short)op + 0xc) * 0x100 | 0x93;
      (J->fold).ins.field_0.op1 = (IRRef1)vb_local._4_4_;
      (J->fold).ins.field_0.op2 = (IRRef1)(TRef)vb_local;
      TVar2 = lj_opt_fold(J);
      return TVar2;
    }
  }
  if ((vb_local._4_4_ & 0x1f000000) != 0xe000000) {
    (J->fold).ins.field_0.ot = 0x5b0e;
    (J->fold).ins.field_0.op1 = (IRRef1)vb_local._4_4_;
    (J->fold).ins.field_0.op2 = 0x1d3;
    vb_local._4_4_ = lj_opt_fold(J);
  }
  if (((TRef)vb_local & 0x1f000000) != 0xe000000) {
    (J->fold).ins.field_0.ot = 0x5b0e;
    (J->fold).ins.field_0.op1 = (IRRef1)(TRef)vb_local;
    (J->fold).ins.field_0.op2 = 0x1d3;
    vb_local._0_4_ = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = (ushort)(op << 8) | 0xe;
  (J->fold).ins.field_0.op1 = (IRRef1)vb_local._4_4_;
  (J->fold).ins.field_0.op2 = (IRRef1)(TRef)vb_local;
  TVar2 = lj_opt_fold(J);
  return TVar2;
}

Assistant:

TRef lj_opt_narrow_arith(jit_State *J, TRef rb, TRef rc,
			 TValue *vb, TValue *vc, IROp op)
{
  rb = conv_str_tonum(J, rb, vb);
  rc = conv_str_tonum(J, rc, vc);
  /* Must not narrow MUL in non-DUALNUM variant, because it loses -0. */
  if ((op >= IR_ADD && op <= (LJ_DUALNUM ? IR_MUL : IR_SUB)) &&
      tref_isinteger(rb) && tref_isinteger(rc) &&
      numisint(lj_vm_foldarith(numberVnum(vb), numberVnum(vc),
			       (int)op - (int)IR_ADD)))
    return emitir(IRTGI((int)op - (int)IR_ADD + (int)IR_ADDOV), rb, rc);
  if (!tref_isnum(rb)) rb = emitir(IRTN(IR_CONV), rb, IRCONV_NUM_INT);
  if (!tref_isnum(rc)) rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  return emitir(IRTN(op), rb, rc);
}